

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O0

void quiver_absorb_num(player *p,object *obj,int *n_add_pack,int *n_to_quiver)

{
  object *obj_00;
  bool bVar1;
  _Bool _Var2;
  _Bool _Var3;
  wchar_t wVar4;
  wchar_t wVar5;
  uint uVar6;
  int iVar7;
  uint local_78;
  wchar_t local_70;
  wchar_t local_6c;
  uint local_68;
  uint local_64;
  wchar_t local_60;
  wchar_t limit_from_pack;
  wchar_t remainder;
  wchar_t mult_1;
  wchar_t mult;
  object *quiver_obj;
  int iStack_3c;
  _Bool displaces;
  wchar_t desired_slot;
  wchar_t n_empty;
  wchar_t space_free;
  wchar_t quiver_count;
  wchar_t i;
  _Bool ammo;
  int *n_to_quiver_local;
  int *n_add_pack_local;
  object *obj_local;
  player *p_local;
  
  _Var2 = tval_is_ammo(obj);
  if ((_Var2) || (_Var3 = flag_has_dbg(obj->flags,6,0x29,"obj->flags","OF_THROWING"), _Var3)) {
    n_empty = L'\0';
    desired_slot = L'\0';
    iStack_3c = 0;
    wVar4 = preferred_quiver_slot(obj);
    bVar1 = false;
    for (space_free = L'\0'; space_free < (int)(uint)z_info->quiver_size;
        space_free = space_free + L'\x01') {
      obj_00 = p->upkeep->quiver[space_free];
      if (obj_00 == (object *)0x0) {
        iStack_3c = iStack_3c + 1;
        if ((_Var2) || (wVar4 == space_free)) {
          desired_slot = (uint)z_info->quiver_slot_size + desired_slot;
        }
      }
      else {
        _Var3 = tval_is_ammo(obj_00);
        if (_Var3) {
          local_64 = 1;
        }
        else {
          local_64 = (uint)z_info->thrown_quiver_mult;
        }
        n_empty = obj_00->number * local_64 + n_empty;
        _Var3 = object_stackable(obj_00,obj,OSTACK_PACK);
        if (_Var3) {
          if ((uint)z_info->quiver_slot_size < obj_00->number * local_64) {
            __assert_fail("quiver_obj->number * mult <= z_info->quiver_slot_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                          ,0x29e,
                          "void quiver_absorb_num(const struct player *, const struct object *, int *, int *)"
                         );
          }
          desired_slot = ((uint)z_info->quiver_slot_size - obj_00->number * local_64) + desired_slot
          ;
        }
        else if ((wVar4 == space_free) &&
                (wVar5 = preferred_quiver_slot(obj_00), wVar5 != space_free)) {
          bVar1 = true;
          if ((uint)z_info->quiver_slot_size < obj_00->number * local_64) {
            __assert_fail("quiver_obj->number * mult <= z_info->quiver_slot_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                          ,0x2ac,
                          "void quiver_absorb_num(const struct player *, const struct object *, int *, int *)"
                         );
          }
          if (_Var2) {
            uVar6 = (uint)z_info->quiver_slot_size - obj_00->number * local_64;
          }
          else {
            uVar6 = (uint)z_info->quiver_slot_size;
          }
          desired_slot = uVar6 + desired_slot;
        }
      }
    }
    if ((desired_slot != L'\0') && (((bVar1 && (iStack_3c != 0)) || (!bVar1)))) {
      if (_Var2) {
        local_68 = 1;
      }
      else {
        local_68 = (uint)z_info->thrown_quiver_mult;
      }
      iVar7 = n_empty % (int)(uint)z_info->quiver_slot_size;
      if (iVar7 == 0) {
        local_6c = L'\0';
      }
      else {
        local_6c = (uint)z_info->quiver_slot_size - iVar7;
      }
      local_60 = local_6c;
      if (0 < *n_add_pack) {
        local_60 = *n_add_pack * (uint)z_info->quiver_slot_size + local_6c;
      }
      if (local_60 < desired_slot) {
        local_70 = local_60;
      }
      else {
        local_70 = desired_slot;
      }
      if (local_70 / (int)local_68 < (int)(uint)obj->number) {
        local_78 = local_70 / (int)local_68;
      }
      else {
        local_78 = (uint)obj->number;
      }
      *n_to_quiver = local_78;
      *n_add_pack = *n_add_pack -
                    (int)((*n_to_quiver * local_68 + (uint)z_info->quiver_slot_size + -1) - iVar7) /
                    (int)(uint)z_info->quiver_slot_size;
      return;
    }
  }
  *n_to_quiver = 0;
  return;
}

Assistant:

static void quiver_absorb_num(const struct player *p, const struct object *obj,
		int *n_add_pack, int *n_to_quiver)
{
	bool ammo = tval_is_ammo(obj);

	/* Must be ammo or good for throwing */
	if (ammo || of_has(obj->flags, OF_THROWING)) {
		int i, quiver_count = 0, space_free = 0, n_empty = 0;
		int desired_slot = preferred_quiver_slot(obj);
		bool displaces = false;

		/* Count the current space this object could go into. */
		for (i = 0; i < z_info->quiver_size; i++) {
			const struct object *quiver_obj = p->upkeep->quiver[i];
			if (quiver_obj) {
				int mult = tval_is_ammo(quiver_obj) ?
					1 : z_info->thrown_quiver_mult;

				quiver_count += quiver_obj->number * mult;
				if (object_stackable(quiver_obj, obj, OSTACK_PACK)) {
					assert(quiver_obj->number * mult <=
						z_info->quiver_slot_size);
					space_free += z_info->quiver_slot_size -
						quiver_obj->number * mult;
				} else if (desired_slot == i &&
						preferred_quiver_slot(quiver_obj) != i) {
					/*
					 * The object to be added prefers to go
					 * in this slot, but it's occupied by
					 * something that could be displaced
					 * to another quiver slot, if one is
					 * available.
					 */
					displaces = true;
					assert(quiver_obj->number * mult <=
						z_info->quiver_slot_size);
					/*
					 * Avoid double counting in the ammo
					 * case since the empty slot, if any,
					 * for the displaced stack is treated
					 * as fully available.
					 */
					if (ammo) {
						space_free += z_info->quiver_slot_size
							- quiver_obj->number
							* mult;
					} else {
						space_free += z_info->quiver_slot_size;
					}
				}
			} else {
				++n_empty;
				/*
				 * Ammo can fit in any empty slot in the quiver.
				 * Non-ammo throwing items are restricted to
				 * their preferred slot.
				 */
				if (ammo || desired_slot == i) {
					space_free += z_info->quiver_slot_size;
				}
			}
		}

		/*
		 * Only possible to add if there is space free in the quiver
		 * and either are displacing a pile with an empty quiver slot
		 * available for it or are not displacing a pile at all.
		 */
		if (space_free && ((displaces && n_empty) || !displaces)) {
			int mult = ammo ? 1 : z_info->thrown_quiver_mult;
			/*
			 * When quiver_count % quiver_slot_size is zero, adding
			 * anything will require a pack slot.
			 */
			int remainder = quiver_count % z_info->quiver_slot_size;
			int limit_from_pack = (remainder) ?
				z_info->quiver_slot_size - remainder : 0;

			if (*n_add_pack > 0) {
				limit_from_pack += *n_add_pack *
					z_info->quiver_slot_size;
			}

			/* Return the number or amount that fits. */
			space_free = MIN(space_free, limit_from_pack);
			*n_to_quiver = MIN(obj->number, space_free / mult);
			*n_add_pack -= (*n_to_quiver * mult +
				z_info->quiver_slot_size - 1 -
				remainder) / z_info->quiver_slot_size;
			return;
		}
	}

	/* Not suitable for the quiver or no space */
	*n_to_quiver = 0;
}